

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O3

Real Omega_h::repro_sum(CommPtr *comm,Reals *a)

{
  int *piVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  Alloc *pAVar6;
  int iVar7;
  Now b;
  double dVar8;
  Real RVar9;
  Int128 x;
  Reals local_58;
  Reals local_48;
  Int128 local_38;
  
  begin_code("repro_sum(comm)",(char *)0x0);
  local_48.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
  if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_48.write_.shared_alloc_.alloc =
           (Alloc *)((local_48.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_48.write_.shared_alloc_.alloc)->use_count =
           (local_48.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar6 = local_48.write_.shared_alloc_.alloc;
  local_48.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
  iVar7 = max_exponent(&local_48);
  if (((ulong)pAVar6 & 7) == 0 && pAVar6 != (Alloc *)0x0) {
    piVar1 = &pAVar6->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar6);
      operator_delete(pAVar6,0x48);
    }
  }
  iVar7 = Comm::allreduce<int>
                    ((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                     iVar7,OMEGA_H_MAX);
  dVar8 = ldexp(1.0,iVar7 + -0x34);
  local_58.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
  if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58.write_.shared_alloc_.alloc =
           (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.write_.shared_alloc_.alloc)->use_count =
           (local_58.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar6 = local_58.write_.shared_alloc_.alloc;
  local_58.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
  x = int128_sum(&local_58,dVar8);
  if (((ulong)pAVar6 & 7) == 0 && pAVar6 != (Alloc *)0x0) {
    piVar1 = &pAVar6->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar6);
      operator_delete(pAVar6,0x48);
    }
  }
  local_38 = Comm::add_int128((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr,x);
  dVar8 = Int128::to_double(&local_38,dVar8);
  plVar5 = profile::global_singleton_history;
  if (profile::global_singleton_history != (long *)0x0) {
    dVar2 = *(double *)
             (*profile::global_singleton_history + 0x30 +
             profile::global_singleton_history[3] * 0x40);
    b = now();
    RVar9 = operator-(b,(Impl)((Impl *)(*plVar5 + 0x28 + plVar5[3] * 0x40))->__d);
    lVar3 = *plVar5;
    lVar4 = plVar5[3];
    *(double *)(lVar3 + 0x30 + lVar4 * 0x40) = RVar9 + dVar2;
    plVar5[3] = *(long *)(lVar3 + lVar4 * 0x40);
  }
  return dVar8;
}

Assistant:

Real repro_sum(CommPtr comm, Reals a) {
  begin_code("repro_sum(comm)");
  auto const init = ArithTraits<int>::min();
  auto expo0 = max_exponent(a);
  int expo = comm->allreduce(expo0, OMEGA_H_MAX);
  if (expo == init) return 0.0;
  double unit = exp2(double(expo - MANTISSA_BITS));
  Int128 fixpt_sum = int128_sum(a, unit);
  fixpt_sum = comm->add_int128(fixpt_sum);
  double ret = fixpt_sum.to_double(unit);
  end_code();
  return ret;
}